

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall
pstore::file::system_error::system_error
          (system_error *this,error_code code,string *user_message,string *path)

{
  error_code __ec;
  string local_50;
  
  __ec._M_cat = code._M_cat;
  *(undefined ***)this = &PTR__system_error_00193878;
  message<std::__cxx11::string>(&local_50,this,user_message,path);
  __ec._0_8_ = code._0_8_ & 0xffffffff;
  std::system_error::system_error(&this->super_system_error,__ec,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__system_error_00193878;
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  return;
}

Assistant:

system_error::system_error (std::error_code const code, std::string const & user_message,
                                    std::string path)
                : std::system_error (code, message (user_message, path))
                , path_ (std::move (path)) {}